

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
::Visit<google::protobuf::DescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  iterator iVar1;
  EnumDescriptor *pEVar2;
  OneofDescriptor *pOVar3;
  long lVar4;
  FieldDescriptor *pFVar5;
  Descriptor *pDVar6;
  ExtensionRange *pEVar7;
  FeatureSet *pFVar8;
  long lVar9;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  DescriptorProto *pDVar10;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_01;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  LifetimesInfo local_80;
  FileDescriptor *local_50;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>::iterator,_bool>
  local_48;
  
  if (descriptor->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
    local_80.full_name._M_str = (descriptor->all_names_).payload_;
    local_50 = descriptor->file_;
    local_80.full_name._M_len = (size_t)*(ushort *)(local_80.full_name._M_str + 2);
    puVar11 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
    local_80.filename._M_str = (char *)*puVar11;
    local_80.filename._M_len = puVar11[1];
    local_80.full_name._M_str = local_80.full_name._M_str + ~local_80.full_name._M_len;
    local_80.proto_features = descriptor->proto_features_;
    local_80.proto = &proto->super_Message;
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
    ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
              (&local_48,(void *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_50);
    iVar1._M_current = *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x10);
    if (iVar1._M_current == *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x18)) {
      std::
      vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
      ::_M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                  *)((long)local_48.first.field_1.slot_ + 8),iVar1,&local_80);
    }
    else {
      ((iVar1._M_current)->filename)._M_len = local_80.filename._M_len;
      ((iVar1._M_current)->filename)._M_str = local_80.filename._M_str;
      ((iVar1._M_current)->full_name)._M_len = local_80.full_name._M_len;
      ((iVar1._M_current)->full_name)._M_str = local_80.full_name._M_str;
      (iVar1._M_current)->proto_features = local_80.proto_features;
      (iVar1._M_current)->proto = local_80.proto;
      *(long *)((long)local_48.first.field_1.slot_ + 0x10) =
           *(long *)((long)local_48.first.field_1.slot_ + 0x10) + 0x30;
    }
  }
  if (0 < descriptor->enum_type_count_) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pEVar2 = descriptor->enum_types_;
      proto_00 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                           (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                            (int)lVar13);
      Visit<google::protobuf::EnumDescriptorProto_const>
                (this,(EnumDescriptor *)(&pEVar2->super_SymbolBase + lVar12),proto_00);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x58;
    } while (lVar13 < descriptor->enum_type_count_);
  }
  if (0 < descriptor->oneof_decl_count_) {
    lVar12 = 0x20;
    lVar13 = 0;
    do {
      pOVar3 = descriptor->oneof_decls_;
      pDVar10 = (DescriptorProto *)
                RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                          (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                           (int)lVar13);
      if (*(FeatureSet **)(&pOVar3->super_SymbolBase + lVar12) !=
          (FeatureSet *)_FeatureSet_default_instance_) {
        lVar4 = *(long *)((long)pOVar3 + lVar12 + -0x18);
        local_50 = *(FileDescriptor **)(*(long *)((long)pOVar3 + lVar12 + -0x10) + 0x18);
        local_80.full_name._M_len = (size_t)*(ushort *)(lVar4 + 2);
        puVar11 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
        local_80.filename._M_str = (char *)*puVar11;
        local_80.filename._M_len = puVar11[1];
        local_80.full_name._M_str = (char *)(~local_80.full_name._M_len + lVar4);
        local_80.proto_features = *(FeatureSet **)(&pOVar3->super_SymbolBase + lVar12);
        local_80.proto = (Message *)pDVar10;
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
        ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
                  (&local_48,(void *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_50);
        iVar1._M_current = *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x10);
        if (iVar1._M_current == *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x18)) {
          std::
          vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
          ::_M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                    ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                      *)((long)local_48.first.field_1.slot_ + 8),iVar1,&local_80);
        }
        else {
          ((iVar1._M_current)->filename)._M_len = local_80.filename._M_len;
          ((iVar1._M_current)->filename)._M_str = local_80.filename._M_str;
          ((iVar1._M_current)->full_name)._M_len = local_80.full_name._M_len;
          ((iVar1._M_current)->full_name)._M_str = local_80.full_name._M_str;
          (iVar1._M_current)->proto_features = local_80.proto_features;
          (iVar1._M_current)->proto = local_80.proto;
          *(long *)((long)local_48.first.field_1.slot_ + 0x10) =
               *(long *)((long)local_48.first.field_1.slot_ + 0x10) + 0x30;
        }
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x38;
    } while (lVar13 < descriptor->oneof_decl_count_);
  }
  if (0 < descriptor->field_count_) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pFVar5 = descriptor->fields_;
      RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,(int)lVar13);
      Visit<google::protobuf::FieldDescriptorProto_const>
                (*(VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                   **)this,*(FieldDescriptor **)(this + 8),
                 (FieldDescriptorProto *)(&pFVar5->super_SymbolBase + lVar12));
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x58;
    } while (lVar13 < descriptor->field_count_);
  }
  if (0 < descriptor->nested_type_count_) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pDVar6 = descriptor->nested_types_;
      proto_01 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                            (int)lVar13);
      Visit<google::protobuf::DescriptorProto_const>
                (this,(Descriptor *)(&pDVar6->super_SymbolBase + lVar12),proto_01);
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0xa0;
    } while (lVar13 < descriptor->nested_type_count_);
  }
  if (0 < descriptor->extension_count_) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pFVar5 = descriptor->extensions_;
      RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,(int)lVar13);
      Visit<google::protobuf::FieldDescriptorProto_const>
                (*(VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                   **)this,*(FieldDescriptor **)(this + 8),
                 (FieldDescriptorProto *)(&pFVar5->super_SymbolBase + lVar12));
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x58;
    } while (lVar13 < descriptor->extension_count_);
  }
  if (0 < descriptor->extension_range_count_) {
    lVar12 = 0x18;
    lVar13 = 0;
    do {
      pEVar7 = descriptor->extension_ranges_;
      pDVar10 = (DescriptorProto *)
                RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                          (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                           (int)lVar13);
      pFVar8 = *(FeatureSet **)((long)&pEVar7->start_ + lVar12);
      if (pFVar8 != (FeatureSet *)_FeatureSet_default_instance_) {
        lVar4 = *(long *)((long)pEVar7 + lVar12 + -8);
        lVar9 = *(long *)(lVar4 + 0x10);
        local_50 = *(FileDescriptor **)(lVar4 + 0x18);
        local_80.full_name._M_len = (size_t)*(ushort *)(lVar9 + 2);
        puVar11 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 200) & 0xfffffffffffffffc);
        local_80.filename._M_str = (char *)*puVar11;
        local_80.filename._M_len = puVar11[1];
        local_80.full_name._M_str = (char *)(~local_80.full_name._M_len + lVar9);
        local_80.proto_features = pFVar8;
        local_80.proto = (Message *)pDVar10;
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
        ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
                  (&local_48,(void *)(*(long *)(*(long *)this + 0x10) + 0x2c0),&local_50);
        iVar1._M_current = *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x10);
        if (iVar1._M_current == *(LifetimesInfo **)((long)local_48.first.field_1.slot_ + 0x18)) {
          std::
          vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
          ::_M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                    ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                      *)((long)local_48.first.field_1.slot_ + 8),iVar1,&local_80);
        }
        else {
          ((iVar1._M_current)->filename)._M_len = local_80.filename._M_len;
          ((iVar1._M_current)->filename)._M_str = local_80.filename._M_str;
          ((iVar1._M_current)->full_name)._M_len = local_80.full_name._M_len;
          ((iVar1._M_current)->full_name)._M_str = local_80.full_name._M_str;
          (iVar1._M_current)->proto_features = local_80.proto_features;
          (iVar1._M_current)->proto = local_80.proto;
          *(long *)((long)local_48.first.field_1.slot_ + 0x10) =
               *(long *)((long)local_48.first.field_1.slot_ + 0x10) + 0x30;
        }
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x28;
    } while (lVar13 < descriptor->extension_range_count_);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }